

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

int unzReadCurrentFile(unzFile file,voidp buf,uint len)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int local_7c;
  int local_78;
  int flush;
  ZPOS64_T uOutThis;
  Bytef *bufBefore;
  ZPOS64_T uTotalOutAfter;
  ZPOS64_T uTotalOutBefore;
  uint local_48;
  uInt i;
  uInt uDoCopy;
  uInt uReadThis;
  file_in_zip64_read_info_s *pfile_in_zip_read_info;
  unz64_s *s;
  int local_28;
  uInt iRead;
  int err;
  uint len_local;
  voidp buf_local;
  unzFile file_local;
  
  local_28 = 0;
  s._4_4_ = 0;
  if (file == (unzFile)0x0) {
    file_local._4_4_ = -0x66;
  }
  else {
    plVar1 = *(long **)((long)file + 0x140);
    if (plVar1 == (long *)0x0) {
      file_local._4_4_ = -0x66;
    }
    else if (*plVar1 == 0) {
      file_local._4_4_ = -100;
    }
    else if (len == 0) {
      file_local._4_4_ = 0;
    }
    else {
      plVar1[4] = (long)buf;
      *(uint *)(plVar1 + 5) = len;
      if (((ulong)plVar1[0x18] < (ulong)len) && ((int)plVar1[0x27] == 0)) {
        *(int *)(plVar1 + 5) = (int)plVar1[0x18];
      }
      if ((plVar1[0x17] + (ulong)*(uint *)(plVar1 + 2) < (ulong)len) && ((int)plVar1[0x27] != 0)) {
        *(int *)(plVar1 + 5) = (int)plVar1[0x17] + (int)plVar1[2];
      }
      do {
        do {
          while( true ) {
            if ((int)plVar1[5] == 0) goto LAB_002a33fb;
            if (((int)plVar1[2] == 0) && (plVar1[0x17] != 0)) {
              i = 0x4000;
              if ((ulong)plVar1[0x17] < 0x4000) {
                i = (uInt)plVar1[0x17];
              }
              if (i == 0) {
                return 0;
              }
              lVar3 = call_zseek64((zlib_filefunc64_32_def *)(plVar1 + 0x19),(voidpf)plVar1[0x24],
                                   plVar1[0xf] + plVar1[0x26],0);
              if (lVar3 != 0) {
                return -1;
              }
              uVar4 = (*(code *)plVar1[0x1a])(plVar1[0x20],plVar1[0x24],*plVar1,i);
              if (uVar4 != i) {
                return -1;
              }
              plVar1[0xf] = (ulong)i + plVar1[0xf];
              plVar1[0x17] = plVar1[0x17] - (ulong)i;
              plVar1[1] = *plVar1;
              *(uInt *)(plVar1 + 2) = i;
            }
            if ((plVar1[0x25] != 0) && ((int)plVar1[0x27] == 0)) break;
            if (((int)plVar1[2] == 0) && (plVar1[0x17] == 0)) {
              if (s._4_4_ == 0) {
                local_78 = 0;
              }
              else {
                local_78 = s._4_4_;
              }
              return local_78;
            }
            if (*(uint *)(plVar1 + 5) < *(uint *)(plVar1 + 2)) {
              local_48 = *(uint *)(plVar1 + 5);
            }
            else {
              local_48 = *(uint *)(plVar1 + 2);
            }
            for (uTotalOutBefore._4_4_ = 0; uTotalOutBefore._4_4_ < local_48;
                uTotalOutBefore._4_4_ = uTotalOutBefore._4_4_ + 1) {
              *(undefined1 *)(plVar1[4] + (ulong)uTotalOutBefore._4_4_) =
                   *(undefined1 *)(plVar1[1] + (ulong)uTotalOutBefore._4_4_);
            }
            plVar1[0x14] = plVar1[0x14] + (ulong)local_48;
            lVar3 = crc32(plVar1[0x15],plVar1[4],local_48);
            plVar1[0x15] = lVar3;
            plVar1[0x18] = plVar1[0x18] - (ulong)local_48;
            *(uint *)(plVar1 + 2) = (int)plVar1[2] - local_48;
            *(uint *)(plVar1 + 5) = (int)plVar1[5] - local_48;
            plVar1[4] = plVar1[4] + (ulong)local_48;
            plVar1[1] = plVar1[1] + (ulong)local_48;
            plVar1[6] = (ulong)local_48 + plVar1[6];
            s._4_4_ = local_48 + s._4_4_;
          }
        } while (plVar1[0x25] == 0xc);
        lVar3 = plVar1[6];
        lVar5 = plVar1[4];
        local_28 = inflate(plVar1 + 1,2);
        if ((-1 < local_28) && (plVar1[7] != 0)) {
          local_28 = -3;
        }
        lVar2 = plVar1[6];
        uVar4 = lVar2 - lVar3;
        plVar1[0x14] = plVar1[0x14] + uVar4;
        lVar5 = crc32(plVar1[0x15],lVar5,uVar4 & 0xffffffff);
        plVar1[0x15] = lVar5;
        plVar1[0x18] = plVar1[0x18] - uVar4;
        local_7c = ((int)lVar2 - (int)lVar3) + s._4_4_;
        if (local_28 == 1) {
          if (local_7c == 0) {
            local_7c = 0;
          }
          return local_7c;
        }
        s._4_4_ = local_7c;
      } while (local_28 == 0);
LAB_002a33fb:
      if (local_28 == 0) {
        file_local._4_4_ = s._4_4_;
      }
      else {
        file_local._4_4_ = local_28;
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

extern int ZEXPORT unzReadCurrentFile(unzFile file, voidp buf, unsigned len)
{
    int err = UNZ_OK;
    uInt iRead = 0;
    unz64_s* s;
    file_in_zip64_read_info_s* pfile_in_zip_read_info;
    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    pfile_in_zip_read_info = s->pfile_in_zip_read;

    if (pfile_in_zip_read_info == NULL)
        return UNZ_PARAMERROR;


    if (pfile_in_zip_read_info->read_buffer == NULL)
        return UNZ_END_OF_LIST_OF_FILE;
    if (len == 0)
        return 0;

    pfile_in_zip_read_info->stream.next_out = (Bytef*)buf;

    pfile_in_zip_read_info->stream.avail_out = (uInt)len;

    if ((len > pfile_in_zip_read_info->rest_read_uncompressed) &&
        (!(pfile_in_zip_read_info->raw)))
        pfile_in_zip_read_info->stream.avail_out =
        (uInt)pfile_in_zip_read_info->rest_read_uncompressed;

    if ((len > pfile_in_zip_read_info->rest_read_compressed +
        pfile_in_zip_read_info->stream.avail_in) &&
        (pfile_in_zip_read_info->raw))
        pfile_in_zip_read_info->stream.avail_out =
        (uInt)pfile_in_zip_read_info->rest_read_compressed +
        pfile_in_zip_read_info->stream.avail_in;

    while (pfile_in_zip_read_info->stream.avail_out > 0)
    {
        if ((pfile_in_zip_read_info->stream.avail_in == 0) &&
            (pfile_in_zip_read_info->rest_read_compressed > 0))
        {
            uInt uReadThis = UNZ_BUFSIZE;
            if (pfile_in_zip_read_info->rest_read_compressed < uReadThis)
                uReadThis = (uInt)pfile_in_zip_read_info->rest_read_compressed;
            if (uReadThis == 0)
                return UNZ_EOF;
            if (ZSEEK64(pfile_in_zip_read_info->z_filefunc,
                pfile_in_zip_read_info->filestream,
                pfile_in_zip_read_info->pos_in_zipfile +
                pfile_in_zip_read_info->byte_before_the_zipfile,
                ZLIB_FILEFUNC_SEEK_SET) != 0)
                return UNZ_ERRNO;
            if (ZREAD64(pfile_in_zip_read_info->z_filefunc,
                pfile_in_zip_read_info->filestream,
                pfile_in_zip_read_info->read_buffer,
                uReadThis) != uReadThis)
                return UNZ_ERRNO;


#            ifndef NOUNCRYPT
            if (s->encrypted)
            {
                uInt i;
                for (i = 0; i < uReadThis; i++)
                    pfile_in_zip_read_info->read_buffer[i] =
                    zdecode(s->keys, s->pcrc_32_tab,
                        pfile_in_zip_read_info->read_buffer[i]);
            }
#            endif


            pfile_in_zip_read_info->pos_in_zipfile += uReadThis;

            pfile_in_zip_read_info->rest_read_compressed -= uReadThis;

            pfile_in_zip_read_info->stream.next_in =
                (Bytef*)pfile_in_zip_read_info->read_buffer;
            pfile_in_zip_read_info->stream.avail_in = (uInt)uReadThis;
        }

        if ((pfile_in_zip_read_info->compression_method == 0) || (pfile_in_zip_read_info->raw))
        {
            uInt uDoCopy, i;

            if ((pfile_in_zip_read_info->stream.avail_in == 0) &&
                (pfile_in_zip_read_info->rest_read_compressed == 0))
                return (iRead == 0) ? UNZ_EOF : iRead;

            if (pfile_in_zip_read_info->stream.avail_out <
                pfile_in_zip_read_info->stream.avail_in)
                uDoCopy = pfile_in_zip_read_info->stream.avail_out;
            else
                uDoCopy = pfile_in_zip_read_info->stream.avail_in;

            for (i = 0; i < uDoCopy; i++)
                *(pfile_in_zip_read_info->stream.next_out + i) =
                *(pfile_in_zip_read_info->stream.next_in + i);

            pfile_in_zip_read_info->total_out_64 = pfile_in_zip_read_info->total_out_64 + uDoCopy;

            pfile_in_zip_read_info->crc32 = crc32(pfile_in_zip_read_info->crc32,
                pfile_in_zip_read_info->stream.next_out,
                uDoCopy);
            pfile_in_zip_read_info->rest_read_uncompressed -= uDoCopy;
            pfile_in_zip_read_info->stream.avail_in -= uDoCopy;
            pfile_in_zip_read_info->stream.avail_out -= uDoCopy;
            pfile_in_zip_read_info->stream.next_out += uDoCopy;
            pfile_in_zip_read_info->stream.next_in += uDoCopy;
            pfile_in_zip_read_info->stream.total_out += uDoCopy;
            iRead += uDoCopy;
        }
        else if (pfile_in_zip_read_info->compression_method == Z_BZIP2ED)
        {
#ifdef HAVE_BZIP2
            uLong uTotalOutBefore, uTotalOutAfter;
            const Bytef* bufBefore;
            uLong uOutThis;

            pfile_in_zip_read_info->bstream.next_in = (char*)pfile_in_zip_read_info->stream.next_in;
            pfile_in_zip_read_info->bstream.avail_in = pfile_in_zip_read_info->stream.avail_in;
            pfile_in_zip_read_info->bstream.total_in_lo32 = pfile_in_zip_read_info->stream.total_in;
            pfile_in_zip_read_info->bstream.total_in_hi32 = 0;
            pfile_in_zip_read_info->bstream.next_out = (char*)pfile_in_zip_read_info->stream.next_out;
            pfile_in_zip_read_info->bstream.avail_out = pfile_in_zip_read_info->stream.avail_out;
            pfile_in_zip_read_info->bstream.total_out_lo32 = pfile_in_zip_read_info->stream.total_out;
            pfile_in_zip_read_info->bstream.total_out_hi32 = 0;

            uTotalOutBefore = pfile_in_zip_read_info->bstream.total_out_lo32;
            bufBefore = (const Bytef*)pfile_in_zip_read_info->bstream.next_out;

            err = BZ2_bzDecompress(&pfile_in_zip_read_info->bstream);

            uTotalOutAfter = pfile_in_zip_read_info->bstream.total_out_lo32;
            uOutThis = uTotalOutAfter - uTotalOutBefore;

            pfile_in_zip_read_info->total_out_64 = pfile_in_zip_read_info->total_out_64 + uOutThis;

            pfile_in_zip_read_info->crc32 = crc32(pfile_in_zip_read_info->crc32, bufBefore, (uInt)(uOutThis));
            pfile_in_zip_read_info->rest_read_uncompressed -= uOutThis;
            iRead += (uInt)(uTotalOutAfter - uTotalOutBefore);

            pfile_in_zip_read_info->stream.next_in = (Bytef*)pfile_in_zip_read_info->bstream.next_in;
            pfile_in_zip_read_info->stream.avail_in = pfile_in_zip_read_info->bstream.avail_in;
            pfile_in_zip_read_info->stream.total_in = pfile_in_zip_read_info->bstream.total_in_lo32;
            pfile_in_zip_read_info->stream.next_out = (Bytef*)pfile_in_zip_read_info->bstream.next_out;
            pfile_in_zip_read_info->stream.avail_out = pfile_in_zip_read_info->bstream.avail_out;
            pfile_in_zip_read_info->stream.total_out = pfile_in_zip_read_info->bstream.total_out_lo32;

            if (err == BZ_STREAM_END)
                return (iRead == 0) ? UNZ_EOF : iRead;
            if (err != BZ_OK)
                break;
#endif
        } // end Z_BZIP2ED
        else
        {
            ZPOS64_T uTotalOutBefore, uTotalOutAfter;
            const Bytef* bufBefore;
            ZPOS64_T uOutThis;
            int flush = Z_SYNC_FLUSH;

            uTotalOutBefore = pfile_in_zip_read_info->stream.total_out;
            bufBefore = pfile_in_zip_read_info->stream.next_out;

            /*
            if ((pfile_in_zip_read_info->rest_read_uncompressed ==
                     pfile_in_zip_read_info->stream.avail_out) &&
                (pfile_in_zip_read_info->rest_read_compressed == 0))
                flush = Z_FINISH;
            */
            err = inflate(&pfile_in_zip_read_info->stream, flush);

            if ((err >= 0) && (pfile_in_zip_read_info->stream.msg != NULL))
                err = Z_DATA_ERROR;

            uTotalOutAfter = pfile_in_zip_read_info->stream.total_out;
            uOutThis = uTotalOutAfter - uTotalOutBefore;

            pfile_in_zip_read_info->total_out_64 = pfile_in_zip_read_info->total_out_64 + uOutThis;

            pfile_in_zip_read_info->crc32 =
                crc32(pfile_in_zip_read_info->crc32, bufBefore,
                (uInt)(uOutThis));

            pfile_in_zip_read_info->rest_read_uncompressed -=
                uOutThis;

            iRead += (uInt)(uTotalOutAfter - uTotalOutBefore);

            if (err == Z_STREAM_END)
                return (iRead == 0) ? UNZ_EOF : iRead;
            if (err != Z_OK)
                break;
        }
    }

    if (err == Z_OK)
        return iRead;
    return err;
}